

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivar.c
# Opt level: O0

void objc_compute_ivar_offsets(Class class)

{
  uint uVar1;
  int iVar2;
  Class poVar3;
  objc_ivar *poVar4;
  size_t sVar5;
  long lVar6;
  objc_class_gsv1 *poVar7;
  objc_class_gsv1 *legacy;
  long padding;
  size_t align;
  long ivar_size;
  objc_ivar *ivar;
  size_t refcount_size;
  long last_computed_offset;
  long last_size;
  long last_offset;
  long next_ivar;
  long ivar_start;
  Class super;
  int i;
  Class super_class;
  Class class_local;
  
  if (class->ivars == (objc_ivar_list *)0x0) {
    poVar3 = class_getSuperclass(class);
    if (poVar3 != (Class)0x0) {
      class->instance_size = poVar3->instance_size;
    }
  }
  else {
    if (class->ivars->size != 0x20) {
      fprintf(_stderr,"Downgrading ivar struct not yet implemented");
      abort();
    }
    if (class->instance_size < 1) {
      poVar3 = class_getSuperclass(class);
      next_ivar = 0;
      if (poVar3 != (Class)0x0) {
        if (poVar3->instance_size < 1) {
          objc_compute_ivar_offsets(poVar3);
        }
        next_ivar = poVar3->instance_size;
      }
      class->instance_size = next_ivar;
      if (class->ivars != (objc_ivar_list *)0x0) {
        last_offset = next_ivar;
        last_size = -0x8000000000000000;
        last_computed_offset = 0;
        refcount_size = 0xffffffffffffffff;
        for (super._4_4_ = 0; super._4_4_ < class->ivars->count; super._4_4_ = super._4_4_ + 1) {
          poVar4 = ivar_at_index(class->ivars,super._4_4_);
          if ((poVar4->size == 0) && (*poVar4->type == 'B')) {
            poVar4->size = 1;
          }
          uVar1 = poVar4->size;
          if ((long)*poVar4->offset < last_size + last_computed_offset) {
            *poVar4->offset = (int)refcount_size + (*poVar4->offset - (int)last_size);
          }
          else {
            last_size = (long)*poVar4->offset;
            *poVar4->offset = (int)last_offset;
            refcount_size = (size_t)*poVar4->offset;
            last_offset = (ulong)uVar1 + last_offset;
            last_computed_offset = (long)poVar4->size;
            sVar5 = ivarGetAlign(poVar4);
            if (((long)*poVar4->offset + 8U) % sVar5 != 0) {
              lVar6 = sVar5 - ((long)*poVar4->offset + 8U) % sVar5;
              *poVar4->offset = *poVar4->offset + (int)lVar6;
              class->instance_size = lVar6 + class->instance_size;
              last_offset = lVar6 + last_offset;
            }
            iVar2 = *poVar4->offset;
            sVar5 = ivarGetAlign(poVar4);
            if (((long)iVar2 + 8U) % sVar5 != 0) {
              __assert_fail("(*ivar->offset + sizeof(uintptr_t)) % ivarGetAlign(ivar) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/ivar.c"
                            ,0x6b,"void objc_compute_ivar_offsets(Class)");
            }
            class->instance_size = (ulong)uVar1 + class->instance_size;
          }
        }
        poVar7 = objc_legacy_class_for_class(class);
        if (poVar7 != (objc_class_gsv1 *)0x0) {
          for (super._4_4_ = 0; super._4_4_ < class->ivars->count; super._4_4_ = super._4_4_ + 1) {
            poVar4 = ivar_at_index(class->ivars,super._4_4_);
            poVar7->ivars[(long)super._4_4_ * 3 + 3].count = *poVar4->offset;
          }
        }
      }
    }
  }
  return;
}

Assistant:

PRIVATE void objc_compute_ivar_offsets(Class class)
{
	if (class->ivars == NULL)
	{
		Class super_class = class_getSuperclass(class);
		if (super_class != Nil)
		{
			class->instance_size = super_class->instance_size;
		}
		return;
	}
	if (class->ivars->size != sizeof(struct objc_ivar))
	{
		fprintf(stderr, "Downgrading ivar struct not yet implemented");
		abort();
	}
	int i = 0;
	/* If this class was compiled with support for late-bound ivars, the
	* instance_size field will contain 0 - {the size of the instance variables
	* declared for just this class}.  The individual instance variable offset
	* fields will then be the offsets from the start of the class, and so must
	* have the size of the parent class prepended. */
	if (class->instance_size <= 0)
	{
		Class super = class_getSuperclass(class);
		long ivar_start = 0;
		if (Nil != super)
		{
			if (super->instance_size <= 0)
			{
				objc_compute_ivar_offsets(super);
			}
			ivar_start = super->instance_size;
		}
		class->instance_size = ivar_start;
		/* For each instance variable, we add the offset if required (it will be zero
		* if this class is compiled with a static ivar layout).  We then set the
		* value of a global variable to the offset value.  
		*
		* Any class compiled with support for the non-fragile ABI, but not actually
		* using it, will export the ivar offset field as a symbol.
		*
		* Note that using non-fragile ivars breaks @defs().  If you need equivalent
		* functionality, provide an alternative @interface with all variables
		* declared @public.
		*/
		if (class->ivars)
		{
			// If the first instance variable had any alignment padding, then we need 
			// to discard it.  We will recompute padding ourself later.
			long next_ivar = ivar_start;
			long last_offset = LONG_MIN;
			long last_size = 0;
			long last_computed_offset = -1;
			size_t refcount_size = sizeof(uintptr_t);
			for (i = 0 ; i < class->ivars->count ; i++)
			{
				struct objc_ivar *ivar = ivar_at_index(class->ivars, i);
				// Clang 7 and 8 have a bug where the size of _Bool is encoded
				// as 0, not 1.  Silently fix this up when we see it.
				if (ivar->size == 0 && ivar->type[0] == 'B')
				{
					ivar->size = 1;
				}
				// We are going to be allocating an extra word for the reference count
				// in front of the object.  This doesn't matter for aligment most of
				// the time, but if we have an instance variable that is a vector type
				// then we will need to ensure that we are properly aligned again.
				long ivar_size = ivar->size;
				// Bitfields have the same offset - the base of the variable
				// that contains them.  If we are in a bitfield, then we need
				// to make sure that we don't add any displacement from the
				// previous value.
				if (*ivar->offset < last_offset + last_size)
				{
					*ivar->offset = last_computed_offset + (*ivar->offset - last_offset);
					ivar_size = 0;
					continue;
				}
				last_offset = *ivar->offset;
				*ivar->offset = next_ivar;
				last_computed_offset = *ivar->offset;
				next_ivar += ivar_size;
				last_size = ivar->size;
				size_t align = ivarGetAlign(ivar);
				if ((*ivar->offset + refcount_size) % align != 0)
				{
					long padding = align - ((*ivar->offset + refcount_size) % align); 
					*ivar->offset += padding;
					class->instance_size += padding;
					next_ivar += padding;
				}
				assert((*ivar->offset + sizeof(uintptr_t)) % ivarGetAlign(ivar) == 0);
				class->instance_size += ivar_size;
			}
#ifdef OLDABI_COMPAT
			// If we have a legacy ivar list, update the offset in it too -
			// code from older compilers may access this directly!
			struct objc_class_gsv1* legacy = objc_legacy_class_for_class(class);
			if (legacy)
			{
				for (i = 0 ; i < class->ivars->count ; i++)
				{
					legacy->ivars->ivar_list[i].offset = *ivar_at_index(class->ivars, i)->offset;
				}
			}
#endif
		}
	}
}